

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

nvpair_t * nvpair_move_descriptor(char *name,int value)

{
  int iVar1;
  int *piVar2;
  nvpair_t *pnVar3;
  
  if (value < 0) {
LAB_0010d782:
    piVar2 = __errno_location();
    *piVar2 = 9;
    pnVar3 = (nvpair_t *)0x0;
  }
  else {
    iVar1 = fcntl(value,1);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 == 9) goto LAB_0010d782;
    }
    pnVar3 = nvpair_allocv(name,6,(ulong)(uint)value,8,0);
    if (pnVar3 == (nvpair_t *)0x0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      close(value);
      *piVar2 = iVar1;
    }
  }
  return pnVar3;
}

Assistant:

nvpair_t *
nvpair_move_descriptor(const char *name, int value)
{
	nvpair_t *nvp;

	if (value < 0 || !fd_is_valid(value)) {
		ERRNO_SET(EBADF);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_DESCRIPTOR, (uint64_t)value,
	    sizeof(int64_t), 0);
	if (nvp == NULL) {
		ERRNO_SAVE();
		close(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}